

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateWriteToBody
          (MessageGenerator *this,Printer *printer,bool use_write_context)

{
  pointer ppFVar1;
  FieldGeneratorBase *pFVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  string_view text;
  string_view text_00;
  
  uVar5 = (ulong)use_write_context;
  for (uVar4 = 0;
      ppFVar1 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->fields_by_number_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar4 = uVar4 + 1) {
    pFVar2 = CreateFieldGeneratorInternal(this,ppFVar1[uVar4]);
    (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xb])(pFVar2,printer,uVar5);
    (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
  }
  if (this->has_extension_ranges_ != false) {
    pcVar3 = "if (_extensions != null) {\n  _extensions.WriteTo(output);\n}\n";
    if (use_write_context) {
      pcVar3 = "if (_extensions != null) {\n  _extensions.WriteTo(ref output);\n}\n";
    }
    text._M_str = pcVar3;
    text._M_len = uVar5 * 4 + 0x3c;
    io::Printer::Print<>(printer,text);
  }
  pcVar3 = "if (_unknownFields != null) {\n  _unknownFields.WriteTo(output);\n}\n";
  if (use_write_context) {
    pcVar3 = "if (_unknownFields != null) {\n  _unknownFields.WriteTo(ref output);\n}\n";
  }
  text_00._M_str = pcVar3;
  text_00._M_len = uVar5 * 4 + 0x42;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void MessageGenerator::GenerateWriteToBody(io::Printer* printer,
                                           bool use_write_context) {
  // Serialize all the fields
  for (int i = 0; i < fields_by_number().size(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fields_by_number()[i]));
    generator->GenerateSerializationCode(printer, use_write_context);
  }

  if (has_extension_ranges_) {
    // Serialize extensions
    printer->Print(use_write_context ? "if (_extensions != null) {\n"
                                       "  _extensions.WriteTo(ref output);\n"
                                       "}\n"
                                     : "if (_extensions != null) {\n"
                                       "  _extensions.WriteTo(output);\n"
                                       "}\n");
  }

  // Serialize unknown fields
  printer->Print(use_write_context ? "if (_unknownFields != null) {\n"
                                     "  _unknownFields.WriteTo(ref output);\n"
                                     "}\n"
                                   : "if (_unknownFields != null) {\n"
                                     "  _unknownFields.WriteTo(output);\n"
                                     "}\n");

  // TODO: Memoize size of frozen messages?
}